

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O3

ScalarFunction * duckdb::CombineFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff04;
  FunctionNullHandling in_stack_ffffffffffffff10;
  bind_lambda_function_t in_stack_ffffffffffffff18;
  scalar_function_t local_e0;
  LogicalType local_c0;
  vector<duckdb::LogicalType,_true> local_a8;
  string local_90;
  LogicalType local_70;
  LogicalType local_58 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"combine","");
  LogicalType::LogicalType(local_58,AGGREGATE_STATE);
  LogicalType::LogicalType(local_58 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8,__l,
             (allocator_type *)&stack0xffffffffffffff1f);
  LogicalType::LogicalType(&local_c0,AGGREGATE_STATE);
  local_e0.super__Function_base._M_functor._8_8_ = 0;
  local_e0.super__Function_base._M_functor._M_unused._M_object = AggregateStateCombine;
  local_e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_70,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_70;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffefc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff04;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_90,&local_a8,&local_c0,&local_e0,BindAggregateState,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,InitCombineState,
             varargs,CONSISTENT,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  LogicalType::~LogicalType(&local_70);
  if (local_e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = ExportStateScalarSerialize;
  in_RDI->deserialize = ExportStateScalarDeserialize;
  return in_RDI;
}

Assistant:

ScalarFunction CombineFun::GetFunction() {
	auto result =
	    ScalarFunction("combine", {LogicalTypeId::AGGREGATE_STATE, LogicalTypeId::ANY}, LogicalTypeId::AGGREGATE_STATE,
	                   AggregateStateCombine, BindAggregateState, nullptr, nullptr, InitCombineState);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.serialize = ExportStateScalarSerialize;
	result.deserialize = ExportStateScalarDeserialize;
	return result;
}